

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstring.cpp
# Opt level: O0

QString * __thiscall QString::leftJustified(QString *this,qsizetype width,QChar fill,bool truncate)

{
  long lVar1;
  qsizetype qVar2;
  char16_t *pcVar3;
  char16_t *__src;
  char16_t in_CX;
  long in_RDX;
  QArrayDataPointer<char16_t> *in_RSI;
  QArrayDataPointer<char16_t> *in_RDI;
  byte in_R8B;
  long in_FS_OFFSET;
  QChar *uc;
  qsizetype padlen;
  qsizetype len;
  QString *result;
  QString *in_stack_ffffffffffffff78;
  QString *in_stack_ffffffffffffff80;
  QArrayDataPointer<char16_t> *n;
  char16_t *local_60;
  long local_58;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  in_RDI->d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  in_RDI->ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  in_RDI->size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  n = in_RDI;
  QString((QString *)0x1d8b9a);
  qVar2 = size((QString *)in_RSI);
  if (in_RDX - qVar2 < 1) {
    if ((in_R8B & 1) == 0) {
      operator=(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
    }
    else {
      left((QString *)in_RSI,(qsizetype)n);
      operator=(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
      ~QString((QString *)0x1d8c90);
    }
  }
  else {
    resize(in_stack_ffffffffffffff80,(qsizetype)in_stack_ffffffffffffff78);
    if (qVar2 != 0) {
      pcVar3 = QArrayDataPointer<char16_t>::data(in_RDI);
      __src = QArrayDataPointer<char16_t>::data(in_RSI);
      memcpy(pcVar3,__src,qVar2 << 1);
    }
    pcVar3 = QArrayDataPointer<char16_t>::data(in_RDI);
    local_60 = pcVar3 + qVar2;
    local_58 = in_RDX - qVar2;
    while (local_58 != 0) {
      *local_60 = in_CX;
      local_60 = local_60 + 1;
      local_58 = local_58 + -1;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (QString *)n;
  }
  __stack_chk_fail();
}

Assistant:

QString QString::leftJustified(qsizetype width, QChar fill, bool truncate) const
{
    QString result;
    qsizetype len = size();
    qsizetype padlen = width - len;
    if (padlen > 0) {
        result.resize(len+padlen);
        if (len)
            memcpy(result.d.data(), d.data(), sizeof(QChar)*len);
        QChar *uc = (QChar*)result.d.data() + len;
        while (padlen--)
           * uc++ = fill;
    } else {
        if (truncate)
            result = left(width);
        else
            result = *this;
    }
    return result;
}